

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O3

int bit_array_test_range(void *array,size_t bit,size_t count)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  
  if ((array != (void *)0x0) && (uVar1 = *array, bit < uVar1)) {
    sVar3 = count;
    if (8 < count && (bit & 7) != 0) {
      while (sVar3 = count, (bit & 7) != 0) {
        if ((*(byte *)((long)array + (bit >> 3) + 8) >> (int)(bit & 7) & 1) != 0) {
          return 1;
        }
        bit = bit + 1;
        sVar3 = count - 1;
        if ((uVar1 <= bit) || (bVar4 = count == 1, count = sVar3, bVar4)) break;
      }
    }
    if (((bit & 7) == 0) && (uVar2 = uVar1 - bit, 7 < sVar3 && 7 < uVar2)) {
      do {
        uVar2 = uVar2 - 8;
        if (*(char *)((long)array + (bit >> 3) + 8) != '\0') {
          return 1;
        }
        bit = bit + 8;
        sVar3 = sVar3 - 8;
      } while ((7 < uVar2) && (7 < sVar3));
    }
    if (sVar3 != 0 && bit < uVar1) {
      do {
        sVar3 = sVar3 - 1;
        if ((*(byte *)((long)array + (bit >> 3) + 8) >> ((uint)bit & 7) & 1) != 0) {
          return 1;
        }
        bit = bit + 1;
      } while ((bit < uVar1) && (sVar3 != 0));
    }
  }
  return 0;
}

Assistant:

int bit_array_test_range(void * array, size_t bit, size_t count)
{
	if (array)
	{
		size_t * size = (size_t *) array;
		if (bit < *size)
		{
			unsigned char * ptr = (unsigned char *)(size + 1);
			if ((bit & 7) && (count > 8))
			{
				while ((bit < *size) && count && (bit & 7))
				{
					if (ptr[bit >> 3] & (1U << (bit & 7))) return 1;
					bit++;
					count--;
				}
			}
			if (!(bit & 7))
			{
				while (((*size - bit) >= 8) && (count >= 8))
				{
					if (ptr[bit >> 3]) return 1;
					bit += 8;
					count -= 8;
				}
			}
			while ((bit < *size) && count)
			{
				if (ptr[bit >> 3] & (1U << (bit & 7))) return 1;
				bit++;
				count--;
			}
		}
	}
	return 0;
}